

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralType.cc
# Opt level: O0

LiteralType flow::elementTypeOf(LiteralType type)

{
  FILE *__stream;
  undefined8 uVar1;
  allocator<char> local_31;
  string local_30 [32];
  LiteralType local_10;
  LiteralType local_c;
  LiteralType type_local;
  
  __stream = _stderr;
  switch(type) {
  case Void:
  case Boolean:
  case Number:
  case String:
  case IPAddress:
  case Cidr:
  case RegExp:
  case Handler:
    local_c = type;
    break;
  default:
    local_10 = type;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_30,"InvalidArgumentError",&local_31);
    uVar1 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s\n",uVar1);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
    abort();
  case IntArray:
    local_c = Number;
    break;
  case StringArray:
    local_c = String;
    break;
  case IPAddrArray:
    local_c = IPAddress;
    break;
  case CidrArray:
    local_c = Cidr;
  }
  return local_c;
}

Assistant:

LiteralType elementTypeOf(LiteralType type) {
  switch (type) {
    case LiteralType::Void:
    case LiteralType::Boolean:
    case LiteralType::Number:
    case LiteralType::String:
    case LiteralType::IPAddress:
    case LiteralType::Cidr:
    case LiteralType::RegExp:
    case LiteralType::Handler:
      return type;
    case LiteralType::IntArray:
      return LiteralType::Number;
    case LiteralType::StringArray:
      return LiteralType::String;
    case LiteralType::IPAddrArray:
      return LiteralType::IPAddress;
    case LiteralType::CidrArray:
      return LiteralType::Cidr;
    default:
      FLOW_ASSERT(false, "InvalidArgumentError");
  }
}